

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O3

uint32_t DivideTest<unsigned_short>::randomSeed(void)

{
  uint uVar1;
  result_type rVar2;
  ulong uVar3;
  size_t __i;
  long lVar4;
  uniform_int_distribution<unsigned_int> randDist;
  mt19937 randGen;
  random_device randomDevice;
  param_type local_2720;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2718;
  random_device local_1390;
  
  std::random_device::random_device(&local_1390);
  uVar1 = std::random_device::_M_getval();
  lVar4 = 1;
  local_2718._M_x[0] = (unsigned_long)uVar1;
  uVar3 = local_2718._M_x[0];
  do {
    uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
    local_2718._M_x[lVar4] = uVar3;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x270);
  local_2718._M_p = 0x270;
  local_2720._M_a = 1;
  local_2720._M_b = 0xffffffff;
  rVar2 = std::uniform_int_distribution<unsigned_int>::operator()
                    ((uniform_int_distribution<unsigned_int> *)&local_2720,&local_2718,&local_2720);
  std::random_device::_M_fini();
  return rVar2;
}

Assistant:

static uint32_t randomSeed() {
#if defined(__AVR__)
        return (uint32_t)analogRead(A0);
#else
        std::random_device randomDevice;
        std::mt19937 randGen(randomDevice());
        std::uniform_int_distribution<uint32_t> randDist(1, std::numeric_limits<uint32_t>::max());
        return randDist(randGen);
#endif
    }